

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TidyFactory.h
# Opt level: O3

not_null<const_slang::SourceManager_*> Registry::getSourceManager(void)

{
  runtime_error *this;
  
  if (sourceManager()::sm != (SourceManager *)0x0) {
    return (not_null<const_slang::SourceManager_*>)sourceManager()::sm;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this,
             "TidyFactory: Trying to get SourceManager, but factory pointer has not been initialized"
            );
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static slang::not_null<const slang::SourceManager*> getSourceManager() {
        if (auto sm = *sourceManager(); sm == nullptr)
            SLANG_THROW(std::runtime_error("TidyFactory: Trying to get SourceManager, but factory "
                                           "pointer has not been initialized"));
        return slang::not_null<const slang::SourceManager*>(*sourceManager());
    }